

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O0

unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_> __thiscall
lunasvg::Document::loadFromFile(Document *this,string *filename)

{
  byte bVar1;
  undefined1 local_250 [8];
  string content;
  istream local_220 [8];
  ifstream fs;
  string *filename_local;
  
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,filename,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::unique_ptr<lunasvg::Document,std::default_delete<lunasvg::Document>>::
    unique_ptr<std::default_delete<lunasvg::Document>,void>
              ((unique_ptr<lunasvg::Document,std::default_delete<lunasvg::Document>> *)this,
               (nullptr_t)0x0);
    content.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)local_250);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (local_220,(string *)local_250,'\0');
    std::ifstream::close();
    loadFromData(this,(string *)local_250);
    content.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_250);
  }
  std::ifstream::~ifstream(local_220);
  return (__uniq_ptr_data<lunasvg::Document,_std::default_delete<lunasvg::Document>,_true,_true>)
         (__uniq_ptr_data<lunasvg::Document,_std::default_delete<lunasvg::Document>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Document> Document::loadFromFile(const std::string& filename)
{
    std::ifstream fs;
    fs.open(filename);
    if(!fs.is_open())
        return nullptr;
    std::string content;
    std::getline(fs, content, '\0');
    fs.close();
    return loadFromData(content);
}